

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysextest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<unsigned_char> *paVar1;
  reference pvVar2;
  allocator<unsigned_char> local_111;
  undefined1 local_110 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> endsysex;
  undefined1 local_f0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> midsysex;
  undefined1 local_d0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> startsysex;
  undefined1 local_b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fullsysex;
  undefined1 local_88 [8];
  MidiFile outputfile;
  char **argv_local;
  int argc_local;
  
  outputfile._104_8_ = argv;
  smf::MidiFile::MidiFile((MidiFile *)local_88);
  smf::MidiFile::addTrack((MidiFile *)local_88,2);
  paVar1 = (allocator<unsigned_char> *)
           ((long)&startsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,0xe,paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&startsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,0);
  *pvVar2 = 0xf0;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,1);
  *pvVar2 = 'C';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,2);
  *pvVar2 = '\x12';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,3);
  *pvVar2 = '\0';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,4);
  *pvVar2 = 'C';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,5);
  *pvVar2 = '\x12';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,6);
  *pvVar2 = '\0';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,7);
  *pvVar2 = 'B';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,8);
  *pvVar2 = '\x12';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,9);
  *pvVar2 = '\0';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,10);
  *pvVar2 = 'C';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,0xb);
  *pvVar2 = '\x12';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,0xc);
  *pvVar2 = '\0';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,0xd);
  *pvVar2 = 0xf7;
  paVar1 = (allocator<unsigned_char> *)
           ((long)&midsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,4,paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&midsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,0);
  *pvVar2 = 0xf0;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,1);
  *pvVar2 = 'C';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,2);
  *pvVar2 = '\x12';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,3);
  *pvVar2 = '\0';
  paVar1 = (allocator<unsigned_char> *)
           ((long)&endsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,7,paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&endsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,0);
  *pvVar2 = 0xf7;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,1);
  *pvVar2 = 'C';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,2);
  *pvVar2 = '\x12';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,3);
  *pvVar2 = '\0';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,4);
  *pvVar2 = 'B';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,5);
  *pvVar2 = '\x12';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,6);
  *pvVar2 = '\0';
  std::allocator<unsigned_char>::allocator(&local_111);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,5,&local_111);
  std::allocator<unsigned_char>::~allocator(&local_111);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,0);
  *pvVar2 = 0xf7;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,1);
  *pvVar2 = 'C';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,2);
  *pvVar2 = '\x12';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,3);
  *pvVar2 = '\0';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,4);
  *pvVar2 = 0xf7;
  smf::MidiFile::setTicksPerQuarterNote((MidiFile *)local_88,100);
  smf::MidiFile::addEvent
            ((MidiFile *)local_88,1,0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
  smf::MidiFile::addEvent
            ((MidiFile *)local_88,2,0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  smf::MidiFile::addEvent
            ((MidiFile *)local_88,2,100,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
  smf::MidiFile::addEvent
            ((MidiFile *)local_88,2,200,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110);
  smf::MidiFile::writeBinasc((MidiFile *)local_88,(ostream *)&std::cout);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
  smf::MidiFile::~MidiFile((MidiFile *)local_88);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
   MidiFile outputfile;        // create an empty MIDI file with one track
   outputfile.addTrack(2);     // Add another two tracks to the MIDI file

   vector<uchar> fullsysex(14);
   fullsysex[0]  = 0xf0;
   // message size will automatically be inserted here when
   // writing to a MIDI file.
   fullsysex[1]  = 0x43;
   fullsysex[2]  = 0x12;
   fullsysex[3]  = 0x00;
   fullsysex[4]  = 0x43;
   fullsysex[5]  = 0x12;
   fullsysex[6]  = 0x00;
   fullsysex[7]  = 0x42;
   fullsysex[8]  = 0x12;
   fullsysex[9]  = 0x00;
   fullsysex[10] = 0x43;
   fullsysex[11] = 0x12;
   fullsysex[12] = 0x00;
   fullsysex[13] = 0xf7;

   vector<uchar> startsysex(4);
   startsysex[0] = 0xf0;
   // Partial message size will automatically be inserted here when
   // writing to a MIDI file (size = 3 bytes).
   startsysex[1] = 0x43;
   startsysex[2] = 0x12;
   startsysex[3] = 0x00;

   vector<uchar> midsysex(7);
   midsysex[0]   = 0xf7;      // sysex continuation marker (not part of msg.)
   // Partial message size will automatically be inserted here when
   // writing to a MIDI file (size = 6 bytes).
   midsysex[1]   = 0x43;
   midsysex[2]   = 0x12;
   midsysex[3]   = 0x00;
   midsysex[4]   = 0x42;
   midsysex[5]   = 0x12;
   midsysex[6]   = 0x00;

   vector<uchar> endsysex(5);
   endsysex[0]   = 0xf7;      // sysex continuation marker (not part of msg.)
   // Partial message size will automatically be inserted here when
   // writing to a MIDI file (size = 4 bytes).
   endsysex[1]   = 0x43;
   endsysex[2]   = 0x12;
   endsysex[3]   = 0x00;
   endsysex[4]   = 0xf7;      // sysex termination marker (part of msg.)

   outputfile.setTicksPerQuarterNote(100);
   outputfile.addEvent(1,   0, fullsysex );
   outputfile.addEvent(2,   0, startsysex);
   outputfile.addEvent(2, 100, midsysex  );
   outputfile.addEvent(2, 200, endsysex  );

   outputfile.writeBinasc(cout);
   //outputfile.writeHex(cout);
   return 0;
}